

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O3

int32_t __thiscall icu_63::ChineseCalendar::winterSolstice(ChineseCalendar *this,int32_t gyear)

{
  int32_t value;
  int32_t iVar1;
  CalendarAstronomer *pCVar2;
  size_t size;
  double dVar3;
  UErrorCode status;
  UErrorCode local_2c;
  double local_28;
  
  local_2c = U_ZERO_ERROR;
  value = CalendarCache::get(&gChineseCalendarWinterSolsticeCache,gyear,&local_2c);
  if (value == 0) {
    size = 0xb;
    dVar3 = Grego::fieldsToDay(gyear,0xb,1);
    local_28 = daysToMillis(this,dVar3);
    umtx_lock_63(&astroLock);
    if (gChineseCalendarAstro == (CalendarAstronomer *)0x0) {
      pCVar2 = (CalendarAstronomer *)UMemory::operator_new((UMemory *)0x88,size);
      if (pCVar2 != (CalendarAstronomer *)0x0) {
        CalendarAstronomer::CalendarAstronomer(pCVar2);
      }
      gChineseCalendarAstro = pCVar2;
      ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
    }
    CalendarAstronomer::setTime(gChineseCalendarAstro,local_28);
    pCVar2 = gChineseCalendarAstro;
    dVar3 = CalendarAstronomer::WINTER_SOLSTICE();
    local_28 = CalendarAstronomer::getSunTime(pCVar2,dVar3,'\x01');
    umtx_unlock_63(&astroLock);
    dVar3 = millisToDays(this,local_28);
    value = (int32_t)dVar3;
    CalendarCache::put(&gChineseCalendarWinterSolsticeCache,gyear,value,&local_2c);
  }
  iVar1 = 0;
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = value;
  }
  return iVar1;
}

Assistant:

int32_t ChineseCalendar::winterSolstice(int32_t gyear) const {

    UErrorCode status = U_ZERO_ERROR;
    int32_t cacheValue = CalendarCache::get(&gChineseCalendarWinterSolsticeCache, gyear, status);

    if (cacheValue == 0) {
        // In books December 15 is used, but it fails for some years
        // using our algorithms, e.g.: 1298 1391 1492 1553 1560.  That
        // is, winterSolstice(1298) starts search at Dec 14 08:00:00
        // PST 1298 with a final result of Dec 14 10:31:59 PST 1299.
        double ms = daysToMillis(Grego::fieldsToDay(gyear, UCAL_DECEMBER, 1));

        umtx_lock(&astroLock);
        if(gChineseCalendarAstro == NULL) {
            gChineseCalendarAstro = new CalendarAstronomer();
            ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
        }
        gChineseCalendarAstro->setTime(ms);
        UDate solarLong = gChineseCalendarAstro->getSunTime(CalendarAstronomer::WINTER_SOLSTICE(), TRUE);
        umtx_unlock(&astroLock);

        // Winter solstice is 270 degrees solar longitude aka Dongzhi
        cacheValue = (int32_t)millisToDays(solarLong);
        CalendarCache::put(&gChineseCalendarWinterSolsticeCache, gyear, cacheValue, status);
    }
    if(U_FAILURE(status)) {
        cacheValue = 0;
    }
    return cacheValue;
}